

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::clusterizer<crnlib::vec<6U,_float>_>::clusterizer
          (clusterizer<crnlib::vec<6U,_float>_> *this)

{
  clusterizer<crnlib::vec<6U,_float>_> *this_local;
  
  vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::vector(&this->m_training_vecs);
  vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::vector(&this->m_nodes);
  vector<crnlib::vec<6U,_float>_>::vector(&this->m_codebook);
  this->m_overall_variance = 0.0;
  this->m_split_index = 0;
  vector<unsigned_int>::vector(&this->m_heap);
  this->m_heap_size = 0;
  this->m_quick = false;
  vector<unsigned_int>::vector(&this->m_left_children);
  vector<unsigned_int>::vector(&this->m_right_children);
  return;
}

Assistant:

clusterizer() :
            m_overall_variance(0.0f),
            m_split_index(0),
            m_heap_size(0),
            m_quick(false)
        {
        }